

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O3

ByteData * __thiscall
cfd::core::Block::GetTxOutProof(ByteData *__return_storage_ptr__,Block *this,Txid *txid)

{
  initializer_list<cfd::core::Txid> __l;
  allocator_type local_51;
  vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> local_50;
  Txid local_38;
  
  Txid::Txid(&local_38,txid);
  __l._M_len = 1;
  __l._M_array = &local_38;
  ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::vector(&local_50,__l,&local_51);
  GetTxOutProof(__return_storage_ptr__,this,&local_50);
  ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::~vector(&local_50);
  local_38._vptr_Txid = (_func_int **)&PTR__Txid_00259ad8;
  if (local_38.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData Block::GetTxOutProof(const Txid& txid) const {
  return GetTxOutProof(std::vector<Txid>{txid});
}